

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

void MAFSA_automaton_enumerate_ints
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               MAFSA_letter delim,void *user_data,MAFSA_automaton_string_handler fetcher)

{
  uint32_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  MAFSA_stack_struct local_38;
  
  puVar1 = ma->ptr_nodes;
  uVar5 = *puVar1;
  local_38.current = -1;
  uVar2 = 0;
  if (sz_l != 0) {
    do {
      uVar3 = uVar5 & 0x7fffffff;
      uVar4 = ma->ptr_links[uVar3];
      uVar6 = 0;
      if (uVar4 != 0xff000000) {
        do {
          uVar3 = uVar3 + 1;
          if (l[uVar2] == (MAFSA_letter)(uVar4 >> 0x18)) {
            uVar6 = uVar4 & 0xffffff;
            break;
          }
          uVar4 = ma->ptr_links[uVar3];
          uVar6 = 0;
        } while (uVar4 != 0xff000000);
      }
      if (uVar6 == 0) break;
      uVar5 = puVar1[uVar6];
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < sz_l);
  }
  if (uVar2 == sz_l) {
    uVar6 = uVar5 & 0x7fffffff;
    uVar4 = ma->ptr_links[uVar6];
    while (uVar3 = 0, uVar4 != 0xff000000) {
      uVar6 = uVar6 + 1;
      if ((MAFSA_letter)(uVar4 >> 0x18) == delim) {
        uVar3 = uVar4 & 0xffffff;
        break;
      }
      uVar4 = ma->ptr_links[uVar6];
    }
    if (uVar3 != 0) {
      local_38.buffer = tmp;
      local_38.reserved = sz_tmp;
      enumerate_ints(ma,&local_38,puVar1[uVar3],fetcher,user_data);
    }
  }
  return;
}

Assistant:

static void MAFSA_automaton_enumerate_ints(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, MAFSA_letter delim, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; i++)
    {
        MAFSA_letter label = l[i];

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i == sz_l && where)
    {
        if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
        {
            enumerate_ints(ma, &tmp_stack, ma->ptr_nodes[where], fetcher, user_data);
        }
    }
}